

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O0

int __thiscall xray_re::xr_surface::compare(xr_surface *this,xr_surface *right)

{
  int result;
  xr_surface *right_local;
  xr_surface *this_local;
  
  this_local._4_4_ = std::__cxx11::string::compare((string *)&this->m_name);
  if ((((this_local._4_4_ == 0) &&
       (this_local._4_4_ = std::__cxx11::string::compare((string *)&this->m_eshader),
       this_local._4_4_ == 0)) &&
      (this_local._4_4_ = std::__cxx11::string::compare((string *)&this->m_cshader),
      this_local._4_4_ == 0)) &&
     (((this_local._4_4_ = std::__cxx11::string::compare((string *)&this->m_gamemtl),
       this_local._4_4_ == 0 &&
       (this_local._4_4_ = std::__cxx11::string::compare((string *)&this->m_texture),
       this_local._4_4_ == 0)) &&
      ((this_local._4_4_ = std::__cxx11::string::compare((string *)&this->m_vmap),
       this_local._4_4_ == 0 &&
       (this_local._4_4_ = __compare<unsigned_int>(&this->m_flags,&right->m_flags),
       this_local._4_4_ == 0)))))) {
    this_local._4_4_ = __compare<unsigned_int>(&this->m_flags,&right->m_flags);
  }
  return this_local._4_4_;
}

Assistant:

int xr_surface::compare(const xr_surface& right) const
{
	int result;
	if ((result = m_name.compare(right.m_name)))
		return result;
	if ((result = m_eshader.compare(right.m_eshader)))
		return result;
	if ((result = m_cshader.compare(right.m_cshader)))
		return result;
	if ((result = m_gamemtl.compare(right.m_gamemtl)))
		return result;
	if ((result = m_texture.compare(right.m_texture)))
		return result;
	if ((result = m_vmap.compare(right.m_vmap)))
		return result;
	if ((result = __compare(m_flags, right.m_flags)))
		return result;
	return __compare(m_flags, right.m_flags);
}